

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O2

void __thiscall
HEkkDualRHS::chooseMultiHyperGraphPart
          (HEkkDualRHS *this,HighsInt *chIndex,HighsInt *chCount,HighsInt chLimit)

{
  double dVar1;
  double dVar2;
  int iVar3;
  HEkk *pHVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  HighsInt section;
  int iVar8;
  HighsInt HVar9;
  int iVar10;
  long lVar11;
  HighsInt HVar12;
  ulong uVar13;
  size_type sVar14;
  ulong uVar15;
  allocator_type local_7d;
  value_type_conflict2 local_7c;
  HighsInt local_78;
  HighsInt local_74;
  vector<int,_std::allocator<int>_> bestIndex;
  vector<double,_std::allocator<double>_> bestMerit;
  
  uVar13 = 0;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x26,0);
  if (this->partNum != chLimit) {
    chooseMultiGlobal(this,chIndex,chCount,chLimit);
    this->partSwitch = 0;
LAB_0033fe9a:
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x26,0);
    return;
  }
  uVar15 = 0;
  if (0 < chLimit) {
    uVar15 = (ulong)(uint)chLimit;
  }
  for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    chIndex[uVar13] = -1;
  }
  *chCount = 0;
  pHVar4 = this->ekk_instance_;
  HVar12 = this->workCount;
  local_78 = chLimit;
  if (HVar12 < 0) {
    HVar9 = HighsRandom::integer(&pHVar4->random_,-HVar12);
    sVar14 = (size_type)local_78;
    bestIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&bestMerit,sVar14,(value_type_conflict1 *)&bestIndex,(allocator_type *)&local_7c);
    local_7c = -1;
    std::vector<int,_std::allocator<int>_>::vector(&bestIndex,sVar14,&local_7c,&local_7d);
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      iVar10 = HVar9;
      iVar3 = 0;
      if (iVar8 == 0) {
        iVar10 = -HVar12;
        iVar3 = HVar9;
      }
      pdVar6 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar5 = (this->workPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar11 = (long)iVar3; lVar11 < iVar10; lVar11 = lVar11 + 1) {
        dVar1 = pdVar6[lVar11];
        if (1e-50 < dVar1) {
          iVar3 = piVar5[lVar11];
          dVar2 = (pHVar4->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar11];
          if (bestMerit.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] * dVar2 < dVar1) {
            bestMerit.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3] = dVar1 / dVar2;
            bestIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar3] = (int)lVar11;
          }
        }
      }
    }
    iVar8 = 0;
    for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
      if (bestIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar13] != -1) {
        lVar11 = (long)iVar8;
        iVar8 = iVar8 + 1;
        chIndex[lVar11] =
             bestIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[uVar13];
      }
    }
  }
  else {
    if (HVar12 == 0) goto LAB_0033fe9a;
    local_74 = HighsRandom::integer(&pHVar4->random_,HVar12);
    sVar14 = (size_type)local_78;
    bestIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&bestMerit,sVar14,(value_type_conflict1 *)&bestIndex,(allocator_type *)&local_7c);
    local_7c = -1;
    std::vector<int,_std::allocator<int>_>::vector(&bestIndex,sVar14,&local_7c,&local_7d);
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      HVar12 = local_74;
      iVar10 = 0;
      if (iVar8 == 0) {
        HVar12 = this->workCount;
        iVar10 = local_74;
      }
      piVar5 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar7 = (this->workPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar11 = (long)iVar10; lVar11 < HVar12; lVar11 = lVar11 + 1) {
        iVar10 = piVar5[lVar11];
        dVar1 = pdVar6[iVar10];
        if (1e-50 < dVar1) {
          iVar3 = piVar7[iVar10];
          dVar2 = (pHVar4->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar10];
          if (bestMerit.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] * dVar2 < dVar1) {
            bestMerit.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3] = dVar1 / dVar2;
            bestIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar3] = iVar10;
          }
        }
      }
    }
    iVar8 = 0;
    for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
      if (bestIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar13] != -1) {
        lVar11 = (long)iVar8;
        iVar8 = iVar8 + 1;
        chIndex[lVar11] =
             bestIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[uVar13];
      }
    }
  }
  *chCount = iVar8;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bestIndex.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&bestMerit.super__Vector_base<double,_std::allocator<double>_>);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x26,0);
  return;
}

Assistant:

void HEkkDualRHS::chooseMultiHyperGraphPart(HighsInt* chIndex,
                                            HighsInt* chCount,
                                            HighsInt chLimit) {
  analysis->simplexTimerStart(ChuzrDualClock);

  // Force to use partition method, unless doesn't exist
  if (partNum != chLimit) {
    chooseMultiGlobal(chIndex, chCount, chLimit);
    partSwitch = 0;
    analysis->simplexTimerStop(ChuzrDualClock);
    return;
  }

  // Initialise
  for (HighsInt i = 0; i < chLimit; i++) chIndex[i] = -1;
  *chCount = 0;

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    vector<double> bestMerit(chLimit, 0);
    vector<HighsInt> bestIndex(chLimit, -1);
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        if (work_infeasibility[iRow] > kHighsZero) {
          HighsInt iPart = workPartition[iRow];
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (bestMerit[iPart] * myWeight < myInfeas) {
            bestMerit[iPart] = myInfeas / myWeight;
            bestIndex[iPart] = iRow;
          }
        }
      }
    }
    HighsInt count = 0;
    for (HighsInt i = 0; i < chLimit; i++) {
      if (bestIndex[i] != -1) {
        chIndex[count++] = bestIndex[i];
      }
    }
    *chCount = count;
  } else {
    // SPARSE mode
    if (workCount == 0) {
      analysis->simplexTimerStop(ChuzrDualClock);
      return;
    }

    HighsInt randomStart = ekk_instance_.random_.integer(workCount);
    vector<double> bestMerit(chLimit, 0);
    vector<HighsInt> bestIndex(chLimit, -1);
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          HighsInt iPart = workPartition[iRow];
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (bestMerit[iPart] * myWeight < myInfeas) {
            bestMerit[iPart] = myInfeas / myWeight;
            bestIndex[iPart] = iRow;
          }
        }
      }
    }
    HighsInt count = 0;
    for (HighsInt i = 0; i < chLimit; i++) {
      if (bestIndex[i] != -1) {
        chIndex[count++] = bestIndex[i];
      }
    }
    *chCount = count;
  }

  analysis->simplexTimerStop(ChuzrDualClock);
}